

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void UpdateWindowInFocusOrderList(ImGuiWindow *window,bool just_created,ImGuiWindowFlags new_flags)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  bool bVar4;
  int local_28;
  int n;
  bool child_flag_changed;
  bool new_is_explicit_child;
  ImGuiContext *g;
  ImGuiWindowFlags new_flags_local;
  bool just_created_local;
  ImGuiWindow *window_local;
  
  pIVar1 = GImGui;
  bVar3 = (new_flags & 0x1000000U) != 0;
  bVar4 = bVar3 != (bool)(window->IsExplicitChild & 1U);
  _new_flags_local = window;
  if (((!just_created) && (!bVar4)) || (bVar3)) {
    if (((!just_created) && (bVar4)) && (bVar3)) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[]
                          (&GImGui->WindowsFocusOrder,(int)window->FocusOrder);
      if (*ppIVar2 != _new_flags_local) {
        __assert_fail("g.WindowsFocusOrder[window->FocusOrder] == window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                      ,0x15f0,
                      "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
      }
      local_28 = (int)_new_flags_local->FocusOrder;
      while (local_28 = local_28 + 1, local_28 < (pIVar1->WindowsFocusOrder).Size) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&pIVar1->WindowsFocusOrder,local_28);
        (*ppIVar2)->FocusOrder = (*ppIVar2)->FocusOrder + -1;
      }
      ImVector<ImGuiWindow_*>::erase
                (&pIVar1->WindowsFocusOrder,
                 (pIVar1->WindowsFocusOrder).Data + (int)_new_flags_local->FocusOrder);
      _new_flags_local->FocusOrder = -1;
    }
  }
  else {
    bVar4 = ImVector<ImGuiWindow_*>::contains
                      (&GImGui->WindowsFocusOrder,(ImGuiWindow **)&new_flags_local);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      __assert_fail("!g.WindowsFocusOrder.contains(window)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/imgui-src/imgui.cpp"
                    ,0x15ea,
                    "void UpdateWindowInFocusOrderList(ImGuiWindow *, bool, ImGuiWindowFlags)");
    }
    ImVector<ImGuiWindow_*>::push_back(&pIVar1->WindowsFocusOrder,(ImGuiWindow **)&new_flags_local);
    _new_flags_local->FocusOrder = (short)(pIVar1->WindowsFocusOrder).Size + -1;
  }
  _new_flags_local->IsExplicitChild = bVar3;
  return;
}

Assistant:

static void UpdateWindowInFocusOrderList(ImGuiWindow* window, bool just_created, ImGuiWindowFlags new_flags)
{
    ImGuiContext& g = *GImGui;

    const bool new_is_explicit_child = (new_flags & ImGuiWindowFlags_ChildWindow) != 0;
    const bool child_flag_changed = new_is_explicit_child != window->IsExplicitChild;
    if ((just_created || child_flag_changed) && !new_is_explicit_child)
    {
        IM_ASSERT(!g.WindowsFocusOrder.contains(window));
        g.WindowsFocusOrder.push_back(window);
        window->FocusOrder = (short)(g.WindowsFocusOrder.Size - 1);
    }
    else if (!just_created && child_flag_changed && new_is_explicit_child)
    {
        IM_ASSERT(g.WindowsFocusOrder[window->FocusOrder] == window);
        for (int n = window->FocusOrder + 1; n < g.WindowsFocusOrder.Size; n++)
            g.WindowsFocusOrder[n]->FocusOrder--;
        g.WindowsFocusOrder.erase(g.WindowsFocusOrder.Data + window->FocusOrder);
        window->FocusOrder = -1;
    }
    window->IsExplicitChild = new_is_explicit_child;
}